

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O3

Variant * Jinx::Impl::GetSize(Variant *__return_storage_ptr__,ScriptPtr param_1,Parameters *params)

{
  ValueType VVar1;
  Variant *this;
  int64_t iVar2;
  size_t value;
  String local_30;
  
  this = (Variant *)
         (param_1.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _M_pi)->_vptr__Sp_counted_base;
  VVar1 = this->m_type;
  if (VVar1 == String) {
    Variant::GetString_abi_cxx11_(&local_30,this);
    value = GetStringCount(&local_30);
    __return_storage_ptr__->m_type = Null;
    Variant::SetInteger(__return_storage_ptr__,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      MemFree(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (VVar1 == Buffer) {
      Variant::GetBuffer((Variant *)&local_30);
      iVar2 = *(int64_t *)(local_30._M_dataplus._M_p + 8);
      __return_storage_ptr__->m_type = Null;
      Variant::SetInteger(__return_storage_ptr__,iVar2);
    }
    else {
      if (VVar1 != Collection) {
        __return_storage_ptr__->m_type = Null;
        Variant::SetNull(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      Variant::GetCollection((Variant *)&local_30);
      iVar2 = *(int64_t *)(local_30._M_dataplus._M_p + 0x28);
      __return_storage_ptr__->m_type = Null;
      Variant::SetInteger(__return_storage_ptr__,iVar2);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_string_length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant GetSize(ScriptPtr, const Parameters & params)
	{
		switch (params[0].GetType())
		{
		case ValueType::Collection:
			return static_cast<int64_t>(params[0].GetCollection()->size());
		case ValueType::String:
			return static_cast<int64_t>(GetStringCount(params[0].GetString()));
		case ValueType::Buffer:
			return static_cast<int64_t>(params[0].GetBuffer()->Size());
		default:
			break;
		}
		return nullptr;
	}